

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

With * sqlite3WithAdd(Parse *pParse,With *pWith,Token *pName,ExprList *pArglist,Select *pQuery)

{
  sqlite3 *db_00;
  int iVar1;
  char *pcVar2;
  sqlite3_int64 nByte;
  int i;
  char *zName;
  With *pNew;
  sqlite3 *db;
  Select *pQuery_local;
  ExprList *pArglist_local;
  Token *pName_local;
  With *pWith_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pcVar2 = sqlite3NameFromToken(pParse->db,pName);
  if ((pcVar2 != (char *)0x0) && (pWith != (With *)0x0)) {
    for (nByte._4_4_ = 0; nByte._4_4_ < pWith->nCte; nByte._4_4_ = nByte._4_4_ + 1) {
      iVar1 = sqlite3StrICmp(pcVar2,pWith->a[nByte._4_4_].zName);
      if (iVar1 == 0) {
        sqlite3ErrorMsg(pParse,"duplicate WITH table name: %s",pcVar2);
      }
    }
  }
  if (pWith == (With *)0x0) {
    zName = (char *)sqlite3DbMallocZero(db_00,0x30);
  }
  else {
    zName = (char *)sqlite3DbRealloc(db_00,pWith,(long)pWith->nCte * 0x20 + 0x30);
  }
  if (db_00->mallocFailed == '\0') {
    *(Select **)(zName + (long)*(int *)zName * 0x20 + 0x20) = pQuery;
    *(ExprList **)(zName + (long)*(int *)zName * 0x20 + 0x18) = pArglist;
    *(char **)(zName + (long)*(int *)zName * 0x20 + 0x10) = pcVar2;
    pcVar2 = zName + (long)*(int *)zName * 0x20 + 0x28;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    *(int *)zName = *(int *)zName + 1;
  }
  else {
    sqlite3ExprListDelete(db_00,pArglist);
    sqlite3SelectDelete(db_00,pQuery);
    sqlite3DbFree(db_00,pcVar2);
    zName = (char *)pWith;
  }
  return (With *)zName;
}

Assistant:

SQLITE_PRIVATE With *sqlite3WithAdd(
  Parse *pParse,          /* Parsing context */
  With *pWith,            /* Existing WITH clause, or NULL */
  Token *pName,           /* Name of the common-table */
  ExprList *pArglist,     /* Optional column name list for the table */
  Select *pQuery          /* Query used to initialize the table */
){
  sqlite3 *db = pParse->db;
  With *pNew;
  char *zName;

  /* Check that the CTE name is unique within this WITH clause. If
  ** not, store an error in the Parse structure. */
  zName = sqlite3NameFromToken(pParse->db, pName);
  if( zName && pWith ){
    int i;
    for(i=0; i<pWith->nCte; i++){
      if( sqlite3StrICmp(zName, pWith->a[i].zName)==0 ){
        sqlite3ErrorMsg(pParse, "duplicate WITH table name: %s", zName);
      }
    }
  }

  if( pWith ){
    sqlite3_int64 nByte = sizeof(*pWith) + (sizeof(pWith->a[1]) * pWith->nCte);
    pNew = sqlite3DbRealloc(db, pWith, nByte);
  }else{
    pNew = sqlite3DbMallocZero(db, sizeof(*pWith));
  }
  assert( (pNew!=0 && zName!=0) || db->mallocFailed );

  if( db->mallocFailed ){
    sqlite3ExprListDelete(db, pArglist);
    sqlite3SelectDelete(db, pQuery);
    sqlite3DbFree(db, zName);
    pNew = pWith;
  }else{
    pNew->a[pNew->nCte].pSelect = pQuery;
    pNew->a[pNew->nCte].pCols = pArglist;
    pNew->a[pNew->nCte].zName = zName;
    pNew->a[pNew->nCte].zCteErr = 0;
    pNew->nCte++;
  }

  return pNew;
}